

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_convolver_test_utils.cpp
# Opt level: O0

void write_array(string *base,string *name,size_t n,float *x)

{
  bool bVar1;
  byte bVar2;
  void *this;
  ulong local_260;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  undefined1 local_228 [8];
  ofstream out;
  float *x_local;
  size_t n_local;
  string *name_local;
  string *base_local;
  
  bVar1 = std::operator!=(base,"");
  if (bVar1) {
    std::operator+(&local_248,base,name);
    std::ofstream::ofstream(local_228,&local_248,0x10);
    std::__cxx11::string::~string((string *)&local_248);
    bVar2 = std::ofstream::is_open();
    if ((bVar2 & 1) == 0) {
      __assert_fail("out.is_open()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/tests/block_convolver_test_utils.cpp"
                    ,0x43,
                    "void write_array(const std::string &, const std::string &, size_t, float *)");
    }
    for (local_260 = 0; local_260 < n; local_260 = local_260 + 1) {
      this = (void *)std::ostream::operator<<(local_228,x[local_260]);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
    std::ofstream::~ofstream(local_228);
  }
  return;
}

Assistant:

void write_array(const std::string &base, const std::string &name, size_t n,
                 float *x) {
  if (base != "") {
    std::ofstream out(base + name);
    assert(out.is_open());
    for (size_t i = 0; i < n; i++) out << x[i] << std::endl;
  }
}